

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::IsSubSymbolOf
          (SymbolEntry *this,DescriptorIndex *index,string_view super_symbol)

{
  pointer pEVar1;
  ulong uVar2;
  int iVar3;
  char *__s1;
  size_type __rlen;
  ulong uVar4;
  
  __s1 = super_symbol._M_str;
  uVar4 = super_symbol._M_len;
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = pEVar1[this->data_offset].encoded_package._M_string_length;
  if (uVar2 != 0) {
    if (uVar4 < uVar2) {
      return false;
    }
    iVar3 = bcmp(__s1,pEVar1[this->data_offset].encoded_package._M_dataplus._M_p,uVar2);
    if (iVar3 != 0) {
      return false;
    }
    __s1 = __s1 + uVar2;
    uVar4 = uVar4 - uVar2;
    if (uVar4 != 0) {
      if (*__s1 != '.') {
        return false;
      }
      __s1 = __s1 + 1;
      uVar4 = uVar4 - 1;
    }
  }
  uVar2 = (this->encoded_symbol)._M_string_length;
  if ((uVar2 != 0) &&
     ((uVar4 < uVar2 ||
      (iVar3 = bcmp(__s1,(this->encoded_symbol)._M_dataplus._M_p,uVar2), iVar3 != 0)))) {
    return false;
  }
  if (uVar4 != uVar2) {
    return __s1[uVar2] == '.';
  }
  return true;
}

Assistant:

bool IsSubSymbolOf(const DescriptorIndex& index,
                       absl::string_view super_symbol) const {
      const auto consume_part = [&](absl::string_view part) {
        if (!absl::ConsumePrefix(&super_symbol, part)) return false;
        return super_symbol.empty() || absl::ConsumePrefix(&super_symbol, ".");
      };
      if (auto p = package(index); !p.empty()) {
        if (!consume_part(p)) return false;
      }
      return consume_part(symbol(index));
    }